

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

gpu_object * gpu_object_find(uint32_t cid,uint32_t handle)

{
  gpu_object *pgVar1;
  
  pgVar1 = gpu_objects;
  while( true ) {
    if (pgVar1 == (gpu_object *)0x0) {
      return (gpu_object *)0x0;
    }
    if ((pgVar1->cid == cid) && (pgVar1->handle == handle)) break;
    pgVar1 = pgVar1->next;
  }
  return pgVar1;
}

Assistant:

struct gpu_object *gpu_object_find(uint32_t cid, uint32_t handle)
{
	struct gpu_object *obj;
	for (obj = gpu_objects; obj != NULL; obj = obj->next)
		if (obj->cid == cid && obj->handle == handle)
			return obj;
	return NULL;
}